

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

void h2o_reprocess_request_deferred
               (h2o_req_t *req,h2o_iovec_t method,h2o_url_scheme_t *scheme,h2o_iovec_t authority,
               h2o_iovec_t path,h2o_req_overrides_t *overrides,int is_delegated)

{
  st_deferred_request_action_t *psVar1;
  
  psVar1 = create_deferred_action(req,0x70,on_reprocess_request_cb);
  psVar1[1].timeout.registered_at = (uint64_t)method.base;
  psVar1[1].timeout.cb = (h2o_timeout_cb)method.len;
  psVar1[1].timeout._link.next = (st_h2o_linklist_t *)scheme;
  psVar1[1].timeout._link.prev = (st_h2o_linklist_t *)authority.base;
  psVar1[1].req = (h2o_req_t *)authority.len;
  psVar1[2].timeout.registered_at = (uint64_t)path.base;
  psVar1[2].timeout.cb = (h2o_timeout_cb)path.len;
  psVar1[2].timeout._link.next = (st_h2o_linklist_t *)overrides;
  *(int *)&psVar1[2].timeout._link.prev = is_delegated;
  return;
}

Assistant:

void h2o_reprocess_request_deferred(h2o_req_t *req, h2o_iovec_t method, const h2o_url_scheme_t *scheme, h2o_iovec_t authority,
                                    h2o_iovec_t path, h2o_req_overrides_t *overrides, int is_delegated)
{
    struct st_reprocess_request_deferred_t *args =
        (struct st_reprocess_request_deferred_t *)create_deferred_action(req, sizeof(*args), on_reprocess_request_cb);
    args->method = method;
    args->scheme = scheme;
    args->authority = authority;
    args->path = path;
    args->overrides = overrides;
    args->is_delegated = is_delegated;
}